

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

_Bool regime_translation_disabled(CPUARMState_conflict *env,ARMMMUIdx mmu_idx)

{
  ulong uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  _Bool _Var4;
  
  if ((env->features & 0x200) == 0) {
    uVar1 = (env->cp15).hcr_el2;
    if (mmu_idx == ARMMMUIdx_Stage2) {
      uVar1 = uVar1 & 0x1001;
    }
    else {
      if (((((uint)uVar1 >> 0x1b & 1) != 0) &&
          (_Var4 = regime_is_secure((CPUARMState_conflict *)(ulong)mmu_idx,mmu_idx), !_Var4)) &&
         (uVar2 = regime_el(env,mmu_idx), uVar2 == 1)) {
        return true;
      }
      if ((mmu_idx - ARMMMUIdx_Stage1_E0 < 3) && (((env->cp15).hcr_el2 & 0x1000) != 0)) {
        return true;
      }
      uVar3 = regime_sctlr(env,mmu_idx);
      uVar1 = uVar3 & 1;
    }
    _Var4 = uVar1 == 0;
  }
  else {
    _Var4 = regime_is_secure((CPUARMState_conflict *)(ulong)mmu_idx,mmu_idx);
    switch((env->v7m).mpu_ctrl[_Var4] & 3) {
    default:
      _Var4 = true;
      break;
    case 1:
      _Var4 = SUB41((mmu_idx & 2) >> 1,0);
      break;
    case 3:
      _Var4 = false;
    }
  }
  return _Var4;
}

Assistant:

static inline bool regime_translation_disabled(CPUARMState *env,
                                               ARMMMUIdx mmu_idx)
{
    if (arm_feature(env, ARM_FEATURE_M)) {
        switch (env->v7m.mpu_ctrl[regime_is_secure(env, mmu_idx)] &
                (R_V7M_MPU_CTRL_ENABLE_MASK | R_V7M_MPU_CTRL_HFNMIENA_MASK)) {
        case R_V7M_MPU_CTRL_ENABLE_MASK:
            /* Enabled, but not for HardFault and NMI */
            return mmu_idx & ARM_MMU_IDX_M_NEGPRI;
        case R_V7M_MPU_CTRL_ENABLE_MASK | R_V7M_MPU_CTRL_HFNMIENA_MASK:
            /* Enabled for all cases */
            return false;
        case 0:
        default:
            /* HFNMIENA set and ENABLE clear is UNPREDICTABLE, but
             * we warned about that in armv7m_nvic.c when the guest set it.
             */
            return true;
        }
    }

    if (mmu_idx == ARMMMUIdx_Stage2) {
        /* HCR.DC means HCR.VM behaves as 1 */
        return (env->cp15.hcr_el2 & (HCR_DC | HCR_VM)) == 0;
    }

    if (env->cp15.hcr_el2 & HCR_TGE) {
        /* TGE means that NS EL0/1 act as if SCTLR_EL1.M is zero */
        if (!regime_is_secure(env, mmu_idx) && regime_el(env, mmu_idx) == 1) {
            return true;
        }
    }

    if ((env->cp15.hcr_el2 & HCR_DC) && arm_mmu_idx_is_stage1_of_2(mmu_idx)) {
        /* HCR.DC means SCTLR_EL1.M behaves as 0 */
        return true;
    }

    return (regime_sctlr(env, mmu_idx) & SCTLR_M) == 0;
}